

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

void __thiscall ADPlanner::UpdateSetMembership(ADPlanner *this,ADState *state)

{
  CKey local_50;
  CKey local_40;
  long local_30;
  long local_28;
  
  if (*(int *)(state + 0x20) == *(int *)(state + 0x24)) {
    if (*(int *)(state + 0x10) != 0) {
      CHeap::deleteheap(this->pSearchStateSpace_->heap,(AbstractSearchState *)state);
      return;
    }
    if (*(long *)state != 0) {
      CList::remove(this->pSearchStateSpace_->inconslist,(char *)state);
      return;
    }
  }
  else if (*(unsigned_short *)(state + 0x28) == this->pSearchStateSpace_->searchiteration) {
    if (*(long *)state == 0) {
      CList::insert(this->pSearchStateSpace_->inconslist,(AbstractSearchState *)state,0);
      return;
    }
  }
  else {
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x36])(&local_30,this,state);
    if (*(int *)(state + 0x10) == 0) {
      if (*(long *)state != 0) {
        CList::remove(this->pSearchStateSpace_->inconslist,(char *)state);
      }
      local_40.key[0] = local_30;
      local_40.key[1] = local_28;
      CHeap::insertheap(this->pSearchStateSpace_->heap,(AbstractSearchState *)state,&local_40);
    }
    else {
      local_50.key[0] = local_30;
      local_50.key[1] = local_28;
      CHeap::updateheap(this->pSearchStateSpace_->heap,(AbstractSearchState *)state,&local_50);
    }
  }
  return;
}

Assistant:

void ADPlanner::UpdateSetMembership(ADState* state)
{
    CKey key;

    if (state->v != state->g) {
        if (state->iterationclosed != pSearchStateSpace_->searchiteration) {
            key = ComputeKey(state);
            if (state->heapindex == 0) {
                //need to remove it because it can happen when updating edge costs and state is in incons
                if (state->listelem[AD_INCONS_LIST_ID] != NULL) {
                    pSearchStateSpace_->inconslist->remove(state, AD_INCONS_LIST_ID);
                }

                pSearchStateSpace_->heap->insertheap(state, key);

            }
            else
                pSearchStateSpace_->heap->updateheap(state, key);
        }
        else if (state->listelem[AD_INCONS_LIST_ID] == NULL) {
            pSearchStateSpace_->inconslist->insert(state, AD_INCONS_LIST_ID);
        }
    }
    else {
        if (state->heapindex != 0)
            pSearchStateSpace_->heap->deleteheap(state);
        else if (state->listelem[AD_INCONS_LIST_ID] != NULL) {
            pSearchStateSpace_->inconslist->remove(state, AD_INCONS_LIST_ID);
        }
    }
}